

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetVertexTolerance(ON_Brep *this,ON_BrepVertex *vertex,bool bLazySet)

{
  ON_BrepTrim *this_00;
  ON_BrepEdge *this_01;
  int iVar1;
  int *piVar2;
  ON_Curve *pOVar3;
  double *pdVar4;
  double dVar5;
  double in_XMM1_Qa;
  double local_138;
  int local_124;
  ON_3dPoint local_100;
  ON_Interval local_e8;
  ON_3dPoint local_d8;
  ON_BrepTrim *local_c0;
  ON_BrepTrim *trim;
  undefined1 local_b0 [4];
  int edge_trim_count;
  double local_90;
  ON_BrepEdge *local_88;
  ON_BrepEdge *edge;
  int local_78;
  int vertex_index;
  int endi;
  int eti;
  int ei;
  int vei;
  ON_Surface *s;
  ON_Interval edge_domain;
  ON_3dPoint uv;
  double d;
  double tolerance;
  int vertex_edge_count;
  bool bLazySet_local;
  ON_BrepVertex *vertex_local;
  ON_Brep *this_local;
  
  if ((vertex->m_tolerance <= 0.0 && vertex->m_tolerance != 0.0) || (!bLazySet)) {
    iVar1 = ON_BrepVertex::EdgeCount(vertex);
    if (iVar1 < 1) {
      vertex->m_tolerance = 0.0;
    }
    else {
      vertex->m_tolerance = -1.23432101234321e+308;
      d = 0.0;
      ON_Interval::ON_Interval((ON_Interval *)&s);
      _ei = (ON_Surface *)0x0;
      edge._4_4_ = vertex->m_vertex_index;
      for (eti = 0; eti < iVar1; eti = eti + 1) {
        piVar2 = ON_SimpleArray<int>::operator[](&vertex->m_ei,eti);
        endi = *piVar2;
        if (endi < 0) {
          return false;
        }
        local_88 = ON_ClassArray<ON_BrepEdge>::operator[]
                             ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,endi);
        pOVar3 = ON_CurveProxy::ProxyCurve(&local_88->super_ON_CurveProxy);
        if (pOVar3 == (ON_Curve *)0x0) {
          return false;
        }
        (*(local_88->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])();
        local_90 = in_XMM1_Qa;
        edge_domain.m_t[0] = in_XMM1_Qa;
        for (local_78 = 0; this_01 = local_88, local_78 < 2; local_78 = local_78 + 1) {
          if (local_88->m_vi[local_78] == edge._4_4_) {
            pdVar4 = ON_Interval::operator[]((ON_Interval *)&s,local_78);
            ON_Curve::PointAt((ON_3dPoint *)local_b0,(ON_Curve *)this_01,*pdVar4);
            dVar5 = ON_3dPoint::DistanceTo(&(vertex->super_ON_Point).point,(ON_3dPoint *)local_b0);
            in_XMM1_Qa = d;
            if (d < dVar5) {
              d = dVar5;
            }
          }
        }
        trim._4_4_ = ON_SimpleArray<int>::Count(&local_88->m_ti);
        for (vertex_index = 0; vertex_index < trim._4_4_; vertex_index = vertex_index + 1) {
          piVar2 = ON_SimpleArray<int>::operator[](&local_88->m_ti,vertex_index);
          local_c0 = Trim(this,*piVar2);
          if (((local_c0 != (ON_BrepTrim *)0x0) &&
              (pOVar3 = ON_BrepTrim::TrimCurveOf(local_c0), pOVar3 != (ON_Curve *)0x0)) &&
             (_ei = ON_BrepTrim::SurfaceOf(local_c0), _ei != (ON_Surface *)0x0)) {
            for (local_78 = 0; this_00 = local_c0, local_78 < 2; local_78 = local_78 + 1) {
              if (local_88->m_vi[local_78] == edge._4_4_) {
                (*(local_c0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x25])();
                if ((local_c0->m_bRev3d & 1U) == 0) {
                  local_124 = local_78;
                }
                else {
                  local_124 = 1 - local_78;
                }
                local_e8.m_t[1] = in_XMM1_Qa;
                pdVar4 = ON_Interval::operator[](&local_e8,local_124);
                ON_Curve::PointAt(&local_d8,(ON_Curve *)this_00,*pdVar4);
                edge_domain.m_t[1] = local_d8.x;
                ON_Surface::PointAt(&local_100,_ei,local_d8.x,local_d8.y);
                dVar5 = ON_3dPoint::DistanceTo(&(vertex->super_ON_Point).point,&local_100);
                in_XMM1_Qa = d;
                if (d < dVar5) {
                  d = dVar5;
                }
              }
            }
          }
        }
      }
      if (2.3283064365386963e-10 < d) {
        local_138 = d * 1.001;
      }
      else {
        local_138 = 0.0;
      }
      vertex->m_tolerance = local_138;
    }
  }
  return 0.0 <= vertex->m_tolerance;
}

Assistant:

bool
ON_Brep::SetVertexTolerance( ON_BrepVertex& vertex,
  bool bLazySet // default = false
                // false: recompute tolerance even if
                //        its current value is positive
                // true:  recompute tolerance only if
                //        its current value is nonpositive
  ) const
{
  if ( vertex.m_tolerance < 0.0 || !bLazySet ) {
    const int vertex_edge_count = vertex.EdgeCount();
    if ( vertex_edge_count < 1 ) {
      vertex.m_tolerance = 0.0;
    }
    else {
      vertex.m_tolerance = ON_UNSET_VALUE;
      double tolerance = 0.0;
      double d;
      ON_3dPoint uv;
      ON_Interval edge_domain;
      //const ON_Curve* c=0;
      const ON_Surface* s=0;
      int vei, ei, eti, endi;
      const int vertex_index = vertex.m_vertex_index;
      for ( vei = 0; vei < vertex_edge_count; vei++ ) 
      {
        ei = vertex.m_ei[vei];
        if ( ei < 0 )
          return false;
        const ON_BrepEdge& edge = m_E[ei];
        if ( !edge.ProxyCurve() )
          return false;
        edge_domain = edge.Domain();
        for ( endi = 0; endi < 2; endi++ )
        {
          if ( edge.m_vi[endi] == vertex_index ) 
          {
            d = vertex.point.DistanceTo( edge.PointAt(edge_domain[endi]) );
            if ( tolerance < d )
              tolerance = d;
          }
        }
        const int edge_trim_count = edge.m_ti.Count();
        for ( eti = 0; eti < edge_trim_count; eti++ ) 
        {
          const ON_BrepTrim* trim = Trim(edge.m_ti[eti]);
          if ( 0 == trim )
            continue;
          if ( 0 == trim->TrimCurveOf() )
            continue;
          s = trim->SurfaceOf();
          if ( 0 == s )
            continue;
          for ( endi = 0; endi < 2; endi++ ) {
            if ( edge.m_vi[endi] == vertex_index ) {
              uv = trim->PointAt( trim->Domain()[trim->m_bRev3d?1-endi:endi] );
              d = vertex.point.DistanceTo( s->PointAt(uv.x,uv.y) );
              if ( tolerance < d )
                tolerance = d;
            }
          }
        }
      }
      vertex.m_tolerance = (tolerance <= ON_ZERO_TOLERANCE) ? 0.0 : 1.001*tolerance;
    }
  }
  return (vertex.m_tolerance >= 0.0) ? true : false;
}